

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O3

void do_close(uv_tcp_t *handle)

{
  int iVar1;
  uv_tcp_t *extraout_RAX;
  uv_tcp_t *puVar2;
  code *pcVar3;
  uv_tcp_t *puVar4;
  uv_shutdown_t *req;
  long lVar5;
  uv_buf_t uStack_50;
  uv_tcp_t *puStack_40;
  
  if (shutdown_before_close == '\x01') {
    req = &shutdown_req;
    pcVar3 = (code *)handle;
    iVar1 = uv_shutdown(&shutdown_req,(uv_stream_t *)handle,shutdown_cb);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_close_reset(handle,close_cb);
      if (iVar1 == -0x16) goto LAB_0016f5f9;
      do_close_cold_4();
      goto LAB_0016f5cb;
    }
    do_close_cold_3();
LAB_0016f60d:
    do_close_cold_1();
    puVar4 = (uv_tcp_t *)pcVar3;
  }
  else {
LAB_0016f5cb:
    pcVar3 = close_cb;
    req = (uv_shutdown_t *)handle;
    iVar1 = uv_tcp_close_reset(handle,close_cb);
    if (iVar1 != 0) goto LAB_0016f60d;
    req = &shutdown_req;
    puVar4 = handle;
    iVar1 = uv_shutdown(&shutdown_req,(uv_stream_t *)handle,shutdown_cb);
    if (iVar1 == -0x6b) {
LAB_0016f5f9:
      uv_close((uv_handle_t *)&tcp_server,(uv_close_cb)0x0);
      return;
    }
  }
  do_close_cold_2();
  puVar2 = (uv_tcp_t *)(((uv_tcp_t *)req)->u).reserved[2];
  if (client_close == '\x01') {
    if (puVar2 == &tcp_client) goto LAB_0016f642;
    shutdown_cb_cold_2();
    puVar2 = extraout_RAX;
  }
  if (puVar2 == &tcp_accepted) {
LAB_0016f642:
    shutdown_cb_called = shutdown_cb_called + 1;
    return;
  }
  shutdown_cb_cold_1();
  if (client_close == '\x01') {
    if ((uv_tcp_t *)req == &tcp_client) goto LAB_0016f676;
    close_cb_cold_2();
  }
  if ((uv_tcp_t *)req != &tcp_accepted) {
    close_cb_cold_1();
    puStack_40 = handle;
    if ((uv_connect_t *)req == &connect_req) {
      uv_read_start((uv_stream_t *)&tcp_client,alloc_cb,read_cb2);
      uStack_50 = uv_buf_init("PING",4);
      lVar5 = 0;
      while( true ) {
        req = (uv_shutdown_t *)((long)write_reqs[0].reserved + lVar5 + -0x10);
        puVar4 = &tcp_client;
        iVar1 = uv_write((uv_write_t *)req,(uv_stream_t *)&tcp_client,&uStack_50,1,write_cb);
        if (iVar1 != 0) break;
        lVar5 = lVar5 + 0xc0;
        if (lVar5 == 0x300) {
          if (client_close == '\x01') {
            do_close(&tcp_client);
          }
          return;
        }
      }
      connect_cb_cold_2();
    }
    connect_cb_cold_1();
    if ((uv_tcp_t *)req == &tcp_client) {
      if (puVar4 == (uv_tcp_t *)0xfffffffffffff001) {
        uv_close((uv_handle_t *)&tcp_client,(uv_close_cb)0x0);
        return;
      }
      return;
    }
    read_cb2_cold_1();
    if (close_cb_called == 0) {
      if ((uv_stream_t *)((uv_tcp_t *)req)->next_closing == (uv_stream_t *)&tcp_client) {
        write_cb_called = write_cb_called + 1;
        return;
      }
    }
    else {
      write_cb_cold_1();
    }
    write_cb_cold_2();
    iVar1 = uv_is_closing((uv_handle_t *)req);
    if (iVar1 != 0) {
      return;
    }
    uv_close((uv_handle_t *)req,(uv_close_cb)0x0);
    return;
  }
LAB_0016f676:
  close_cb_called = close_cb_called + 1;
  return;
}

Assistant:

static void do_close(uv_tcp_t* handle) {
  if (shutdown_before_close == 1) {
    ASSERT(0 == uv_shutdown(&shutdown_req, (uv_stream_t*) handle, shutdown_cb));
    ASSERT(UV_EINVAL == uv_tcp_close_reset(handle, close_cb));
  } else {
    ASSERT(0 == uv_tcp_close_reset(handle, close_cb));
    ASSERT(UV_ENOTCONN == uv_shutdown(&shutdown_req, (uv_stream_t*) handle, shutdown_cb));
  }

  uv_close((uv_handle_t*) &tcp_server, NULL);
}